

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O2

Adjacency_Graph<true> * Disa::create_graph_saad(void)

{
  Adjacency_Graph<true> *in_RDI;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  pair<unsigned_long,_unsigned_long> local_1f8;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_1f8.first = 0;
  local_1f8.second = 6;
  local_1e8 = 0;
  local_1e0 = 8;
  local_1d8 = 1;
  local_1d0 = 7;
  local_1c8 = 1;
  local_1c0 = 8;
  local_1b8 = 1;
  local_1b0 = 10;
  local_1a8 = 1;
  local_1a0 = 0xc;
  local_198 = 2;
  local_190 = 6;
  local_188 = 2;
  local_180 = 7;
  local_178 = 2;
  local_170 = 9;
  local_168 = 3;
  local_160 = 0xb;
  local_158 = 3;
  local_150 = 0xc;
  local_148 = 3;
  local_140 = 0xe;
  local_138 = 4;
  local_130 = 9;
  local_128 = 4;
  local_120 = 10;
  local_118 = 4;
  local_110 = 0xb;
  local_108 = 4;
  local_100 = 0xd;
  local_f8 = 5;
  local_f0 = 0xd;
  local_e8 = 5;
  local_e0 = 0xe;
  local_d8 = 6;
  local_d0 = 7;
  local_c8 = 6;
  local_c0 = 8;
  local_b8 = 7;
  local_b0 = 8;
  local_a8 = 7;
  local_a0 = 9;
  local_98 = 7;
  local_90 = 10;
  local_88 = 9;
  local_80 = 10;
  local_78 = 10;
  local_70 = 0xb;
  local_68 = 10;
  local_60 = 0xc;
  local_58 = 0xb;
  local_50 = 0xc;
  local_48 = 0xb;
  local_40 = 0xd;
  local_38 = 0xb;
  local_30 = 0xe;
  local_28 = 0xd;
  local_20 = 0xe;
  edge_graph._M_len = 0x1e;
  edge_graph._M_array = &local_1f8;
  Adjacency_Graph<false>::Adjacency_Graph((Adjacency_Graph<false> *)in_RDI,edge_graph);
  return in_RDI;
}

Assistant:

inline Adjacency_Graph<false> create_graph_saad() {
  return Adjacency_Graph<false>({{0, 6},   {0, 8},   {1, 7},   {1, 8},   {1, 10},  {1, 12}, {2, 6},  {2, 7},
                                 {2, 9},   {3, 11},  {3, 12},  {3, 14},  {4, 9},   {4, 10}, {4, 11}, {4, 13},
                                 {5, 13},  {5, 14},  {6, 7},   {6, 8},   {7, 8},   {7, 9},  {7, 10}, {9, 10},
                                 {10, 11}, {10, 12}, {11, 12}, {11, 13}, {11, 14}, {13, 14}});
}